

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O0

void __thiscall soplex::DataArray<bool>::reSize(DataArray<bool> *this,int newsize)

{
  int in_ESI;
  int *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI[1] < in_ESI) {
    reMax((DataArray<bool> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDI >> 0x20)
          ,(int)in_RDI);
  }
  else if (in_ESI < 0) {
    *in_RDI = 0;
  }
  else {
    *in_RDI = in_ESI;
  }
  return;
}

Assistant:

void reSize(int newsize)
   {
      assert(memFactor >= 1);

      if(newsize > themax)
         reMax(int(memFactor * newsize), newsize);
      else if(newsize < 0)
         thesize = 0;
      else
         thesize = newsize;
   }